

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_test.cc
# Opt level: O0

bool __thiscall
FileTest::GetInstructionBytes
          (FileTest *this,vector<unsigned_char,_std::allocator<unsigned_char>_> *out,string *key)

{
  bool bVar1;
  bool local_61;
  undefined1 local_40 [8];
  string value;
  string *key_local;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *out_local;
  FileTest *this_local;
  
  value.field_2._8_8_ = key;
  std::__cxx11::string::string((string *)local_40);
  bVar1 = GetInstruction(this,(string *)local_40,(string *)value.field_2._8_8_);
  local_61 = false;
  if (bVar1) {
    local_61 = ConvertToBytes(this,out,(string *)local_40);
  }
  std::__cxx11::string::~string((string *)local_40);
  return local_61;
}

Assistant:

bool FileTest::GetInstructionBytes(std::vector<uint8_t> *out,
                                   const std::string &key) {
  std::string value;
  return GetInstruction(&value, key) && ConvertToBytes(out, value);
}